

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

void __thiscall rapidxml::xml_document<char>::parse<0>(xml_document<char> *this,char *text)

{
  xml_node<char> *child;
  parse_error *this_00;
  xml_node<char> *node;
  char *text_local;
  xml_document<char> *this_local;
  
  node = (xml_node<char> *)text;
  text_local = (char *)this;
  if (text == (char *)0x0) {
    __assert_fail("text",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/rapidxml/rapidxml.hpp"
                  ,0x567,"void rapidxml::xml_document<>::parse(Ch *) [Ch = char, Flags = 0]");
  }
  xml_node<char>::remove_all_nodes(&this->super_xml_node<char>);
  xml_node<char>::remove_all_attributes(&this->super_xml_node<char>);
  parse_bom<0>(this,(char **)&node);
  while( true ) {
    skip<rapidxml::xml_document<char>::whitespace_pred,0>((char **)&node);
    if (*(char *)&(node->super_xml_base<char>).m_name == '\0') {
      return;
    }
    if (*(char *)&(node->super_xml_base<char>).m_name != '<') break;
    node = (xml_node<char> *)((long)&(node->super_xml_base<char>).m_name + 1);
    child = parse_node<0>(this,(char **)&node);
    if (child != (xml_node<char> *)0x0) {
      xml_node<char>::append_node(&this->super_xml_node<char>,child);
    }
  }
  this_00 = (parse_error *)__cxa_allocate_exception(0x18);
  parse_error::parse_error(this_00,"expected <",node);
  __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

void parse(Ch *text)
        {
            assert(text);
            
            // Remove current contents
            this->remove_all_nodes();
            this->remove_all_attributes();
            
            // Parse BOM, if any
            parse_bom<Flags>(text);
            
            // Parse children
            while (1)
            {
                // Skip whitespace before node
                skip<whitespace_pred, Flags>(text);
                if (*text == 0)
                    break;

                // Parse and append new child
                if (*text == Ch('<'))
                {
                    ++text;     // Skip '<'
                    if (xml_node<Ch> *node = parse_node<Flags>(text))
                        this->append_node(node);
                }
                else
                    RAPIDXML_PARSE_ERROR("expected <", text);
            }

        }